

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O0

bool __thiscall
mocker::detail::InterferenceGraph::isCoalesceAbleToAMachineReg
          (InterferenceGraph *this,Node *v,Node *r)

{
  bool bVar1;
  mapped_type *this_00;
  mapped_type *pmVar2;
  shared_ptr<mocker::nasm::Register> local_68;
  shared_ptr<mocker::nasm::Register> local_58;
  shared_ptr<mocker::nasm::Register> *local_48;
  shared_ptr<mocker::nasm::Register> *t;
  iterator __end2;
  iterator __begin2;
  mapped_type *__range2;
  Node *r_local;
  Node *v_local;
  InterferenceGraph *this_local;
  
  this_00 = std::
            unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>_>
            ::at(&this->originalAdjList,v);
  __end2 = std::
           unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
           ::begin(this_00);
  t = (shared_ptr<mocker::nasm::Register> *)
      std::
      unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ::end(this_00);
  do {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true>,
                       (_Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true> *)&t);
    if (!bVar1) {
      return true;
    }
    local_48 = std::__detail::_Node_iterator<std::shared_ptr<mocker::nasm::Register>,_true,_true>::
               operator*(&__end2);
    bVar1 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::shared_ptr<mocker::nasm::Register>>
                      (&this->coalesced,local_48);
    if ((((!bVar1) &&
         (bVar1 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::shared_ptr<mocker::nasm::Register>>
                            (&this->removed,local_48), !bVar1)) &&
        (pmVar2 = std::
                  unordered_map<std::shared_ptr<mocker::nasm::Register>,_unsigned_long,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>_>
                  ::at(&this->curDegree,local_48), 0xd < *pmVar2)) &&
       (bVar1 = isPrecolored(local_48), !bVar1)) {
      std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_58,local_48);
      std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_68,r);
      bVar1 = isAdjacent(this,&local_58,&local_68);
      std::shared_ptr<mocker::nasm::Register>::~shared_ptr(&local_68);
      std::shared_ptr<mocker::nasm::Register>::~shared_ptr(&local_58);
      if (!bVar1) {
        return false;
      }
    }
    std::__detail::_Node_iterator<std::shared_ptr<mocker::nasm::Register>,_true,_true>::operator++
              (&__end2);
  } while( true );
}

Assistant:

bool InterferenceGraph::isCoalesceAbleToAMachineReg(const Node &v,
                                                    const Node &r) {
  // Do not use getCurAdjList here.
  // This condition usually fails very soon, whence we do need to build the
  // entire adjacent list.

  for (auto &t : originalAdjList.at(v)) {
    // Note that since most nodes removed are of degree < K, we may omit the
    // isIn(removed, t) here to speed up the process.
    if (isIn(coalesced, t) || isIn(removed, t))
      continue;
    if (curDegree.at(t) < K)
      continue;
    if (isPrecolored(t))
      continue;
    if (isAdjacent(t, r))
      continue;
    return false;
  }
  return true;
}